

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChConstraintTwoGeneric.cpp
# Opt level: O1

void __thiscall
chrono::ChConstraintTwoGeneric::Build_Cq
          (ChConstraintTwoGeneric *this,ChSparseMatrix *storage,int insrow)

{
  int iVar1;
  double *pdVar2;
  long lVar3;
  long lVar4;
  
  if (((this->super_ChConstraintTwo).variables_a)->disabled == false) {
    pdVar2 = (this->Cq_a).super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>.m_storage.
             m_data;
    lVar3 = (this->Cq_a).super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>.m_storage.
            m_cols;
    if (lVar3 < 0 && pdVar2 != (double *)0x0) goto LAB_007f20d0;
    if (0 < lVar3) {
      iVar1 = ((this->super_ChConstraintTwo).variables_a)->offset;
      lVar4 = 0;
      do {
        (**storage->_vptr_SparseMatrix)
                  (pdVar2[lVar4],storage,(ulong)(uint)insrow,(ulong)(uint)(iVar1 + (int)lVar4),1);
        lVar4 = lVar4 + 1;
      } while (lVar3 != lVar4);
    }
  }
  if (((this->super_ChConstraintTwo).variables_b)->disabled == false) {
    pdVar2 = (this->Cq_b).super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>.m_storage.
             m_data;
    lVar3 = (this->Cq_b).super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>.m_storage.
            m_cols;
    if (lVar3 < 0 && pdVar2 != (double *)0x0) {
LAB_007f20d0:
      __assert_fail("(dataPtr == 0) || ( rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols))"
                    ,"/usr/include/eigen3/Eigen/src/Core/MapBase.h",0xb2,
                    "Eigen::MapBase<Eigen::Ref<const Eigen::Matrix<double, -1, -1, 1>>>::MapBase(PointerType, Index, Index) [Derived = Eigen::Ref<const Eigen::Matrix<double, -1, -1, 1>>, Level = 0]"
                   );
    }
    if (0 < lVar3) {
      iVar1 = ((this->super_ChConstraintTwo).variables_b)->offset;
      lVar4 = 0;
      do {
        (**storage->_vptr_SparseMatrix)
                  (pdVar2[lVar4],storage,(ulong)(uint)insrow,(ulong)(uint)(iVar1 + (int)lVar4),1);
        lVar4 = lVar4 + 1;
      } while (lVar3 != lVar4);
    }
  }
  return;
}

Assistant:

void ChConstraintTwoGeneric::Build_Cq(ChSparseMatrix& storage, int insrow) {
    if (variables_a->IsActive())
        PasteMatrix(storage, Cq_a, insrow, variables_a->GetOffset());
    if (variables_b->IsActive())
        PasteMatrix(storage, Cq_b, insrow, variables_b->GetOffset());
}